

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void quantize_row_q5_1_ref(float *x,block_q5_1 *y,int64_t k)

{
  float fVar1;
  ggml_fp16_t gVar2;
  uint uVar3;
  uint uVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint8_t xi1;
  uint8_t xi0;
  float x1;
  float x0;
  int j_1;
  uint32_t qh;
  float id;
  float d;
  float v;
  int j;
  float max;
  float min;
  int i;
  int nb;
  int qk;
  undefined4 local_54;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_30;
  float f;
  undefined4 local_28;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < (int)(in_RDX / 0x20); local_24 = local_24 + 1) {
    local_28 = 3.4028235e+38;
    f = -3.4028235e+38;
    for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
      fVar1 = *(float *)(in_RDI + (long)(local_24 * 0x20 + local_30) * 4);
      if (fVar1 < local_28) {
        local_28 = fVar1;
      }
      if (f < fVar1) {
        f = fVar1;
      }
    }
    local_54 = (f - local_28) / 31.0;
    if ((local_54 != 0.0) || (NAN(local_54))) {
      local_54 = 1.0 / local_54;
    }
    else {
      local_54 = 0.0;
    }
    gVar2 = ggml_compute_fp32_to_fp16(f);
    *(ggml_fp16_t *)(in_RSI + (long)local_24 * 0x18) = gVar2;
    gVar2 = ggml_compute_fp32_to_fp16(f);
    *(ggml_fp16_t *)(in_RSI + (long)local_24 * 0x18 + 2) = gVar2;
    local_40 = 0;
    for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
      uVar3 = (uint)((*(float *)(in_RDI + (long)(local_24 * 0x20 + local_44) * 4) - local_28) *
                     local_54 + 0.5);
      uVar4 = (uint)((*(float *)(in_RDI + (long)(local_24 * 0x20 + 0x10 + local_44) * 4) - local_28)
                     * local_54 + 0.5);
      *(byte *)(in_RSI + (long)local_24 * 0x18 + 8 + (long)local_44) =
           (byte)uVar3 & 0xf | (byte)((uVar4 & 0xf) << 4);
      local_40 = ((uVar4 & 0x10) >> 4) << ((byte)local_44 + 0x10 & 0x1f) |
                 ((uVar3 & 0x10) >> 4) << ((byte)local_44 & 0x1f) | local_40;
    }
    *(uint *)(in_RSI + (long)local_24 * 0x18 + 4) = local_40;
  }
  return;
}

Assistant:

void quantize_row_q5_1_ref(const float * GGML_RESTRICT x, block_q5_1 * GGML_RESTRICT y, int64_t k) {
    const int qk = QK5_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        float min = FLT_MAX;
        float max = -FLT_MAX;

        for (int j = 0; j < qk; j++) {
            const float v = x[i*qk + j];

            if (v < min) min = v;
            if (v > max) max = v;
        }

        const float d  = (max - min) / ((1 << 5) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);
        y[i].m = GGML_FP32_TO_FP16(min);

        uint32_t qh = 0;

        for (int j = 0; j < qk/2; ++j) {
            const float x0 = (x[i*qk + 0    + j] - min)*id;
            const float x1 = (x[i*qk + qk/2 + j] - min)*id;

            const uint8_t xi0 = (uint8_t)(x0 + 0.5f);
            const uint8_t xi1 = (uint8_t)(x1 + 0.5f);

            y[i].qs[j] = (xi0 & 0x0F) | ((xi1 & 0x0F) << 4);

            // get the 5-th bit and store it in qh at the right position
            qh |= ((xi0 & 0x10u) >> 4) << (j + 0);
            qh |= ((xi1 & 0x10u) >> 4) << (j + qk/2);
        }

        memcpy(&y[i].qh, &qh, sizeof(y[i].qh));
    }
}